

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TileSwitch.cpp
# Opt level: O0

void __thiscall TileSwitch::~TileSwitch(TileSwitch *this)

{
  void *in_RDI;
  TileSwitch *in_stack_00000050;
  
  ~TileSwitch(in_stack_00000050);
  operator_delete(in_RDI);
  return;
}

Assistant:

TileSwitch::~TileSwitch() {
    getBoardPtr()->switchUpdates.erase(this);
    auto mapIter = getBoardPtr()->switchKeybinds.find(_charID);
    for (auto vectorIter = mapIter->second.begin(); vectorIter != mapIter->second.end(); ++vectorIter) {
        if (*vectorIter == this) {
            mapIter->second.erase(vectorIter);
            break;
        }
    }
    getBoardPtr()->tileLabels.erase(this);
}